

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# file_util.cc
# Opt level: O2

bool __thiscall bssl::TemporaryDirectory::Init(TemporaryDirectory *this)

{
  char *pcVar1;
  bool bVar2;
  string path;
  char *local_30;
  long local_28;
  
  GetTempDir_abi_cxx11_();
  if (local_28 != 0) {
    std::__cxx11::string::append((char *)&local_30);
    pcVar1 = mkdtemp(local_30);
    if (pcVar1 != (char *)0x0) {
      std::__cxx11::string::operator=((string *)this,(string *)&local_30);
      bVar2 = true;
      goto LAB_001dc129;
    }
    perror("Could not make temporary directory");
  }
  bVar2 = false;
LAB_001dc129:
  std::__cxx11::string::~string((string *)&local_30);
  return bVar2;
}

Assistant:

bool TemporaryDirectory::Init() {
  std::string path = GetTempDir();
  if (path.empty()) {
    return false;
  }

#if defined(OPENSSL_WINDOWS)
  // For simplicity, just try the first candidate and assume the directory
  // doesn't exist. 128 bits of cryptographically secure randomness is plenty.
  uint8_t buf[16];
  RAND_bytes(buf, sizeof(buf));
  path += "bssl_tmp_dir." + EncodeHex(buf);
  if (!CreateDirectoryA(path.c_str(), /*lpSecurityAttributes=*/nullptr)) {
    perror("Could not make temporary directory");
    return false;
  }
#else
  path += "bssl_tmp_dir.XXXXXX";
  if (mkdtemp(path.data()) == nullptr) {
    perror("Could not make temporary directory");
    return false;
  }
#endif

  path_ = std::move(path);
  return true;
}